

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

BOOL __thiscall
Js::JavascriptArray::DirectDeleteItemAt<double>(JavascriptArray *this,uint32 itemIndex)

{
  bool bVar1;
  Recycler *recycler;
  SparseArraySegmentBase **ppSVar2;
  double value;
  SparseArraySegmentBase *pSStack_28;
  uint32 limit;
  SparseArraySegment<double> *next;
  uint32 itemIndex_local;
  JavascriptArray *this_local;
  
  if (itemIndex < (this->super_ArrayObject).length) {
    pSStack_28 = GetBeginLookupSegment(this,itemIndex,true);
    while( true ) {
      bVar1 = false;
      if (pSStack_28 != (SparseArraySegmentBase *)0x0) {
        bVar1 = pSStack_28->left <= itemIndex;
      }
      if (!bVar1) goto LAB_01109c00;
      if (itemIndex < pSStack_28->left + pSStack_28->length) break;
      ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                          ((WriteBarrierPtr *)&pSStack_28->next);
      pSStack_28 = &SparseArraySegment<double>::From(*ppSVar2)->super_SparseArraySegmentBase;
    }
    recycler = RecyclableObject::GetRecycler((RecyclableObject *)this);
    value = SparseArraySegment<double>::GetMissingItem();
    SparseArraySegment<double>::SetElement
              ((SparseArraySegment<double> *)pSStack_28,recycler,itemIndex,value);
    if (itemIndex - pSStack_28->left == pSStack_28->length - 1) {
      pSStack_28->length = pSStack_28->length - 1;
      SparseArraySegmentBase::CheckLengthvsSize(pSStack_28);
    }
    else {
      ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                          ((WriteBarrierPtr *)&this->head);
      if (pSStack_28 == *ppSVar2) {
        SetHasNoMissingValues(this,false);
      }
    }
LAB_01109c00:
    (*(this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])();
  }
  return 1;
}

Assistant:

BOOL JavascriptArray::DirectDeleteItemAt(uint32 itemIndex)
    {
        if (itemIndex >= length)
        {
            return true;
        }
        SparseArraySegment<T>* next = (SparseArraySegment<T>*)GetBeginLookupSegment(itemIndex);
        while(next != nullptr && next->left <= itemIndex)
        {
            uint32 limit = next->left + next->length;
            if (itemIndex < limit)
            {
                next->SetElement(GetRecycler(), itemIndex, SparseArraySegment<T>::GetMissingItem());
                if(itemIndex - next->left == next->length - 1)
                {
                    --next->length;
                    next->CheckLengthvsSize();
                }
                else if(next == head)
                {
                    SetHasNoMissingValues(false);
                }
                break;
            }
            next = SparseArraySegment<T>::From(next->next);
        }
#ifdef VALIDATE_ARRAY
        ValidateArray();
#endif
        return true;
    }